

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_info.hpp
# Opt level: O1

string * __thiscall
iutest::TestInfo::test_name_with_where_abi_cxx11_(string *__return_storage_ptr__,TestInfo *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->m_testname)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->m_testname)._M_string_length);
  if (((this->m_value_param)._M_string_length != 0) &&
     ((this->m_value_param)._M_dataplus._M_p != (pointer)0x0)) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(this->m_value_param)._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

::std::string test_name_with_where() const
    {
        ::std::string str = m_testname;
        if( value_param() != NULL )
        {
            str += ", where GetParam() = ";
            str += m_value_param;
        }
        return str;
    }